

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalAssignExpression(Evaluator *this,Assign *expr,Env *env)

{
  GCPtr<symbols::Object> this_00;
  bool bVar1;
  Object *pOVar2;
  long *local_120;
  string local_f0;
  GCPtr<symbols::Object> local_d0;
  GCPtr<symbols::Object> rightValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_61;
  string local_60;
  long *local_40;
  BuiltinObject *builtin;
  GCPtr<symbols::Object> local_28;
  GCPtr<symbols::Object> leftValue;
  Env *env_local;
  Assign *expr_local;
  
  leftValue.addr = (Object *)env;
  Eval((Evaluator *)&local_28,&((expr->super_BinaryOp).LeftOp)->super_Node,env);
  bVar1 = isError(&local_28);
  if (bVar1) {
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&local_28);
    builtin._0_4_ = 1;
  }
  else {
    pOVar2 = GCPtr<symbols::Object>::raw(&local_28);
    if (pOVar2 == (Object *)0x0) {
      local_120 = (long *)0x0;
    }
    else {
      local_120 = (long *)__dynamic_cast(pOVar2,&symbols::Object::typeinfo,
                                         &symbols::BuiltinObject::typeinfo,0);
    }
    local_40 = local_120;
    if (local_120 == (long *)0x0) {
      Eval((Evaluator *)&local_d0,&((expr->super_BinaryOp).RightOp)->super_Node,
           (Env *)leftValue.addr);
      bVar1 = isError(&local_d0);
      this_00 = leftValue;
      if (bVar1) {
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&local_d0);
      }
      else {
        (*(((expr->super_BinaryOp).LeftOp)->super_Node)._vptr_Node[3])(&local_f0);
        pOVar2 = GCPtr<symbols::Object>::unref(&local_d0);
        symbols::Env::put((Env *)this_00.addr,&local_f0,pOVar2);
        std::__cxx11::string::~string((string *)&local_f0);
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
      }
      builtin._0_4_ = 1;
      GCPtr<symbols::Object>::~GCPtr(&local_d0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"AssignError: ",&local_61);
      (**(code **)(*local_40 + 0x18))(&rightValue);
      std::operator+(&local_a8,"can\'t assign \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rightValue);
      std::operator+(&local_88,&local_a8,"\'");
      newError(this,&local_60,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&rightValue);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      builtin._0_4_ = 1;
    }
  }
  GCPtr<symbols::Object>::~GCPtr(&local_28);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalAssignExpression(Assign *expr, Env *env){
    auto leftValue = Eval(expr->LeftOp, env);
    if(isError(leftValue)){
        return leftValue;
    }
    if(auto builtin = dynamic_cast<BuiltinObject*>(leftValue.raw())){
        return newError("AssignError: ", "can't assign '" + builtin->toString() + "'");
    }
    auto rightValue = Eval(expr->RightOp, env);
    if(isError(rightValue)){
        return rightValue;
    }
    env->put(expr->LeftOp->toString(), rightValue.unref());
    return NATIVE_NULL;
}